

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.h
# Opt level: O1

void __thiscall
cbtQuantizedBvh::mergeInternalNodeAabb
          (cbtQuantizedBvh *this,int nodeIndex,cbtVector3 *newAabbMin,cbtVector3 *newAabbMax)

{
  cbtOptimizedBvhNode *pcVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  cbtQuantizedBvhNode *pcVar8;
  cbtOptimizedBvhNode *pcVar9;
  long lVar10;
  unsigned_short quantizedAabbMax [3];
  unsigned_short quantizedAabbMin [3];
  
  if (this->m_useQuantization == true) {
    fVar2 = (this->m_bvhAabbMin).m_floats[0];
    fVar3 = (this->m_bvhAabbMin).m_floats[1];
    fVar4 = (this->m_bvhAabbMin).m_floats[2];
    fVar5 = (this->m_bvhQuantization).m_floats[0];
    fVar6 = (this->m_bvhQuantization).m_floats[1];
    fVar7 = (this->m_bvhQuantization).m_floats[2];
    quantizedAabbMin[0] = (ushort)(int)((newAabbMin->m_floats[0] - fVar2) * fVar5) & 0xfffe;
    quantizedAabbMin[1] = (ushort)(int)((newAabbMin->m_floats[1] - fVar3) * fVar6) & 0xfffe;
    quantizedAabbMin[2] = (ushort)(int)((newAabbMin->m_floats[2] - fVar4) * fVar7) & 0xfffe;
    quantizedAabbMax[0] = (ushort)(int)(fVar5 * (newAabbMax->m_floats[0] - fVar2) + 1.0) | 1;
    quantizedAabbMax[1] = (ushort)(int)(fVar6 * (newAabbMax->m_floats[1] - fVar3) + 1.0) | 1;
    quantizedAabbMax[2] = (ushort)(int)(fVar7 * (newAabbMax->m_floats[2] - fVar4) + 1.0) | 1;
    pcVar8 = (this->m_quantizedContiguousNodes).m_data;
    lVar10 = 0;
    do {
      if (quantizedAabbMin[lVar10] < pcVar8[nodeIndex].m_quantizedAabbMin[lVar10]) {
        pcVar8[nodeIndex].m_quantizedAabbMin[lVar10] = quantizedAabbMin[lVar10];
      }
      if (pcVar8[nodeIndex].m_quantizedAabbMax[lVar10] < quantizedAabbMax[lVar10]) {
        pcVar8[nodeIndex].m_quantizedAabbMax[lVar10] = quantizedAabbMax[lVar10];
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
  }
  else {
    pcVar9 = (this->m_contiguousNodes).m_data;
    pcVar1 = pcVar9 + nodeIndex;
    if (newAabbMin->m_floats[0] < pcVar9[nodeIndex].m_aabbMinOrg.m_floats[0]) {
      (pcVar1->m_aabbMinOrg).m_floats[0] = newAabbMin->m_floats[0];
    }
    if (newAabbMin->m_floats[1] < (pcVar1->m_aabbMinOrg).m_floats[1]) {
      (pcVar1->m_aabbMinOrg).m_floats[1] = newAabbMin->m_floats[1];
    }
    if (newAabbMin->m_floats[2] < (pcVar1->m_aabbMinOrg).m_floats[2]) {
      (pcVar1->m_aabbMinOrg).m_floats[2] = newAabbMin->m_floats[2];
    }
    if (newAabbMin->m_floats[3] < (pcVar1->m_aabbMinOrg).m_floats[3]) {
      (pcVar1->m_aabbMinOrg).m_floats[3] = newAabbMin->m_floats[3];
    }
    if ((pcVar1->m_aabbMaxOrg).m_floats[0] < newAabbMax->m_floats[0]) {
      (pcVar1->m_aabbMaxOrg).m_floats[0] = newAabbMax->m_floats[0];
    }
    if ((pcVar1->m_aabbMaxOrg).m_floats[1] < newAabbMax->m_floats[1]) {
      (pcVar1->m_aabbMaxOrg).m_floats[1] = newAabbMax->m_floats[1];
    }
    if ((pcVar1->m_aabbMaxOrg).m_floats[2] < newAabbMax->m_floats[2]) {
      (pcVar1->m_aabbMaxOrg).m_floats[2] = newAabbMax->m_floats[2];
    }
    if ((pcVar1->m_aabbMaxOrg).m_floats[3] < newAabbMax->m_floats[3]) {
      (pcVar1->m_aabbMaxOrg).m_floats[3] = newAabbMax->m_floats[3];
      return;
    }
  }
  return;
}

Assistant:

void mergeInternalNodeAabb(int nodeIndex, const cbtVector3& newAabbMin, const cbtVector3& newAabbMax)
	{
		if (m_useQuantization)
		{
			unsigned short int quantizedAabbMin[3];
			unsigned short int quantizedAabbMax[3];
			quantize(quantizedAabbMin, newAabbMin, 0);
			quantize(quantizedAabbMax, newAabbMax, 1);
			for (int i = 0; i < 3; i++)
			{
				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] > quantizedAabbMin[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] = quantizedAabbMin[i];

				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] < quantizedAabbMax[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] = quantizedAabbMax[i];
			}
		}
		else
		{
			//non-quantized
			m_contiguousNodes[nodeIndex].m_aabbMinOrg.setMin(newAabbMin);
			m_contiguousNodes[nodeIndex].m_aabbMaxOrg.setMax(newAabbMax);
		}
	}